

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O3

int asn_INTEGER2long(INTEGER_t *iptr,long *lptr)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  byte bVar8;
  
  if ((iptr == (INTEGER_t *)0x0) ||
     (pbVar4 = iptr->buf, lptr == (long *)0x0 || pbVar4 == (byte *)0x0)) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
LAB_00140d39:
    iVar2 = -1;
  }
  else {
    uVar6 = (ulong)iptr->size;
    pbVar1 = pbVar4 + uVar6;
    if (8 < uVar6) {
      if (pbVar4 < pbVar1 + -1) {
        bVar8 = *pbVar4;
        lVar7 = uVar6 - 1;
        pbVar3 = pbVar4;
        do {
          pbVar4 = pbVar3;
          if (bVar8 == 0xff) {
            bVar8 = pbVar4[1];
            if (-1 < (char)bVar8) break;
          }
          else if ((bVar8 != 0) || (bVar8 = pbVar4[1], (char)bVar8 < '\0')) break;
          pbVar3 = pbVar4 + 1;
          lVar7 = lVar7 + -1;
          pbVar4 = pbVar1 + -1;
        } while (lVar7 != 0);
      }
      if (8 < (ulong)((long)pbVar1 - (long)pbVar4)) {
        piVar5 = __errno_location();
        *piVar5 = 0x22;
        goto LAB_00140d39;
      }
    }
    if (pbVar1 == pbVar4) {
      *lptr = 0;
    }
    else {
      uVar6 = (ulong)((char)*pbVar4 >> 7);
      for (; pbVar4 < pbVar1; pbVar4 = pbVar4 + 1) {
        uVar6 = uVar6 << 8 | (ulong)*pbVar4;
      }
      *lptr = uVar6;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
asn_INTEGER2long(const INTEGER_t *iptr, long *lptr) {
	uint8_t *b, *end;
	size_t size;
	long l;

	/* Sanity checking */
	if(!iptr || !iptr->buf || !lptr) {
		errno = EINVAL;
		return -1;
	}

	/* Cache the begin/end of the buffer */
	b = iptr->buf;	/* Start of the INTEGER buffer */
	size = iptr->size;
	end = b + size;	/* Where to stop */

	if(size > sizeof(long)) {
		uint8_t *end1 = end - 1;
		/*
		 * Slightly more advanced processing,
		 * able to >sizeof(long) bytes,
		 * when the actual value is small
		 * (0x0000000000abcdef would yield a fine 0x00abcdef)
		 */
		/* Skip out the insignificant leading bytes */
		for(; b < end1; b++) {
			switch(*b) {
			case 0x00: if((b[1] & 0x80) == 0) continue; break;
			case 0xff: if((b[1] & 0x80) != 0) continue; break;
			}
			break;
		}

		size = end - b;
		if(size > sizeof(long)) {
			/* Still cannot fit the long */
			errno = ERANGE;
			return -1;
		}
	}

	/* Shortcut processing of a corner case */
	if(end == b) {
		*lptr = 0;
		return 0;
	}

	/* Perform the sign initialization */
	/* Actually l = -(*b >> 7); gains nothing, yet unreadable! */
	if((*b >> 7)) l = -1; else l = 0;

	/* Conversion engine */
	for(; b < end; b++)
		l = (l << 8) | *b;

	*lptr = l;
	return 0;
}